

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTcDictEntry * __thiscall CTcParser::declare_dict(CTcParser *this,char *txt,size_t len)

{
  tctarg_obj_id_t is_extern;
  tc_symtype_t tVar1;
  tc_metaclass_t tVar2;
  CTcSymObjBase *this_00;
  CTcSymObj *this_01;
  CTcToken *pCVar3;
  char *str;
  size_t sVar4;
  long in_RDI;
  CTcDictEntry *entry;
  CTcSymObj *sym;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CTcTokenizer *in_stack_ffffffffffffff80;
  CTcSymObj *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CTcDictEntry *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  this_00 = (CTcSymObjBase *)
            CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_ffffffffffffff80,
                               (textchar_t *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               0x2196b5);
  if (this_00 == (CTcSymObjBase *)0x0) {
    this_01 = (CTcSymObj *)CTcSymbolBase::operator_new(0x2196d0);
    pCVar3 = CTcTokenizer::getcur(G_tok);
    str = CTcToken::get_text(pCVar3);
    pCVar3 = CTcTokenizer::getcur(G_tok);
    sVar4 = CTcToken::get_text_len(pCVar3);
    is_extern = CTcGenTarg::new_obj_id(G_cg);
    CTcSymObj::CTcSymObj
              (this_01,str,(size_t)pCVar3,(int)(sVar4 >> 0x20),(vm_obj_id_t)sVar4,is_extern,
               (tc_metaclass_t)in_RDI,in_stack_ffffffffffffffc8);
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),this_01);
    local_28 = create_dict_entry((CTcParser *)CONCAT44(is_extern,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88);
  }
  else {
    tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00);
    if (tVar1 == TC_SYM_OBJ) {
      tVar2 = CTcSymObjBase::get_metaclass(this_00);
      if (tVar2 != TC_META_DICT) {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    local_28 = get_dict_entry((CTcParser *)in_stack_ffffffffffffff80,
                              (CTcSymObj *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (local_28 == (CTcDictEntry *)0x0) {
      local_28 = create_dict_entry((CTcParser *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   in_stack_ffffffffffffff88);
    }
  }
  return local_28;
}

Assistant:

CTcDictEntry *CTcParser::declare_dict(const char *txt, size_t len)
{
    CTcSymObj *sym;
    CTcDictEntry *entry = 0;

    /* look up the symbol */
    sym = (CTcSymObj *)global_symtab_->find(txt, len);

    /* if it's not defined, add it; otherwise, make sure it's correct */
    if (sym == 0)
    {
        /* it's not yet defined - define it as a dictionary */
        sym = new CTcSymObj(G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            FALSE, G_cg->new_obj_id(), FALSE,
                            TC_META_DICT, 0);

        /* add it to the global symbol table */
        global_symtab_->add_entry(sym);

        /* create a new dictionary entry */
        entry = create_dict_entry(sym);
    }
    else
    {
        /* make sure it's an object of metaclass 'dictionary' */
        if (sym->get_type() != TC_SYM_OBJ)
        {
            /* log an error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_OBJ);

            /* forget the symbol - it's not even an object */
            sym = 0;
        }
        else if (sym->get_metaclass() != TC_META_DICT)
        {
            /* it's an object, but not a dictionary - log an error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_DICT);

            /* forget the symbol */
            sym = 0;
        }

        /* find it in our dictionary list */
        entry = get_dict_entry(sym);

        /* 
         *   if we didn't find the entry, we must have loaded the symbol from
         *   a symbol file - add the dictionary list entry now 
         */
        if (entry == 0)
            entry = create_dict_entry(sym);
    }

    /* return the new dictionary object */
    return entry;
}